

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Mode __thiscall
Catch::Clara::Parser::handlePositional
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  long lVar1;
  string data;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined2 local_68 [12];
  string local_50 [32];
  
  if (this->inQuotes == false) {
    local_78 = (undefined1  [8])local_68;
    local_68[0] = 0;
    local_70._M_p = (pointer)0x1;
    lVar1 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)c);
    std::__cxx11::string::~string((string *)local_78);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)arg);
      local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
      std::__cxx11::string::string((string *)&local_70,local_50);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      emplace_back<Catch::Clara::Parser::Token>(tokens,(Token *)local_78);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_50);
      return None;
    }
  }
  return this->mode;
}

Assistant:

Mode handlePositional( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( inQuotes || std::string( "\0", 1 ).find( c ) == std::string::npos )
                return mode;

            std::string data = arg.substr( from, i-from );
            tokens.push_back( Token( Token::Positional, data ) );
            return None;
        }